

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_channel.cc
# Opt level: O3

void __thiscall
assembler::VirtualChannel::finish
          (VirtualChannel *this,
          unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *spdu,
          vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
          *out)

{
  SessionPDU *pSVar1;
  ostream *poVar2;
  
  pSVar1 = (spdu->_M_t).
           super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
           ._M_t.
           super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
           .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl;
  if ((*(size_t *)((long)&(pSVar1->m_)._M_t + 0x28) != 0) &&
     (((pSVar1->ph_).dataLength + 7 >> 3) + (ulong)(pSVar1->ph_).totalHeaderLength ==
      (long)*(pointer *)
             ((long)&(pSVar1->buf_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> + 8) -
      *(long *)&(pSVar1->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl)) {
    std::
    vector<std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>,std::allocator<std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>>
    ::
    emplace_back<std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>
              ((vector<std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>,std::allocator<std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>>
                *)out,spdu);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"VC ",3);
  poVar2 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cerr,
                      ((spdu->_M_t).
                       super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
                       .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl)->vcid);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,": Dropping malformed S_PDU for APID ",0x24);
  poVar2 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar2,
                      ((spdu->_M_t).
                       super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
                       .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl)->apid);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," (",2);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," bytes)",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void VirtualChannel::finish(
    std::unique_ptr<SessionPDU> spdu,
    std::vector<std::unique_ptr<SessionPDU>>& out) {
  // Must have complete header
  if (spdu->hasCompleteHeader()) {
    // Ensure that the reported size is equal to the actual size
    auto ph = spdu->getPrimaryHeader();
    auto size = ph.totalHeaderLength + ((ph.dataLength + 7) / 8);
    if (size == spdu->size()) {
      out.push_back(std::move(spdu));
      return;
    }
  }

  std::cerr
    << "VC "
    << spdu->vcid
    << ": Dropping malformed S_PDU for APID "
    << spdu->apid
    << " (" << spdu->size() << " bytes)"
    << std::endl;
}